

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

Integer pnga_sprs_array_duplicate(Integer s_a)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Integer IVar4;
  long lVar5;
  logical lVar6;
  Integer *pIVar7;
  long in_RDI;
  Integer thi [3];
  Integer tlo [3];
  char p_trans [2];
  Integer i;
  Integer hi;
  Integer lo;
  Integer s_dup;
  Integer nproc;
  Integer me;
  Integer grp;
  Integer new_hdl;
  int local_sync_end;
  int local_sync_begin;
  Integer hdl;
  Integer in_stack_000000f8;
  char *in_stack_00000100;
  char *in_stack_000001d8;
  Integer *in_stack_000001e0;
  Integer in_stack_000001e8;
  Integer *in_stack_00000268;
  Integer *in_stack_00000270;
  Integer in_stack_00000278;
  Integer in_stack_00000280;
  Integer *in_stack_000009f8;
  Integer in_stack_00000a00;
  Integer *in_stack_00000a08;
  Integer *in_stack_00000a10;
  Integer in_stack_00000a18;
  char *in_stack_00000a20;
  Integer *in_stack_00000a30;
  Integer in_stack_ffffffffffffff60;
  Integer in_stack_ffffffffffffff78;
  Integer in_stack_ffffffffffffff80;
  Integer in_stack_ffffffffffffff88;
  Integer in_stack_ffffffffffffff90;
  long local_58;
  
  lVar3 = in_RDI + 1000;
  IVar4 = SPA[lVar3].grp;
  pnga_pgroup_nodeid(IVar4);
  pnga_pgroup_nnodes(IVar4);
  iVar2 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    pnga_pgroup_sync(in_stack_ffffffffffffff60);
  }
  pnga_mask_sync((long)iVar1,(long)iVar2);
  IVar4 = pnga_sprs_array_create
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78);
  lVar5 = IVar4 + 1000;
  pnga_mask_sync((long)iVar1,(long)iVar2);
  lVar6 = pnga_duplicate(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
  if (lVar6 == 0) {
    pnga_error(in_stack_00000100,in_stack_000000f8);
  }
  pnga_mask_sync((long)iVar1,(long)iVar2);
  lVar6 = pnga_duplicate(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
  if (lVar6 == 0) {
    pnga_error(in_stack_00000100,in_stack_000000f8);
  }
  pnga_mask_sync((long)iVar1,(long)iVar2);
  lVar6 = pnga_duplicate(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
  if (lVar6 == 0) {
    pnga_error(in_stack_00000100,in_stack_000000f8);
  }
  pnga_mask_sync((long)iVar1,(long)iVar2);
  lVar6 = pnga_duplicate(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
  if (lVar6 == 0) {
    pnga_error(in_stack_00000100,in_stack_000000f8);
  }
  pnga_distribution(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
  pnga_mask_sync((long)iVar1,(long)iVar2);
  pnga_copy_patch(in_stack_00000a20,in_stack_00000a18,in_stack_00000a10,in_stack_00000a08,
                  in_stack_00000a00,in_stack_000009f8,in_stack_00000a30);
  pnga_distribution(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
  pnga_mask_sync((long)iVar1,(long)iVar2);
  pnga_copy_patch(in_stack_00000a20,in_stack_00000a18,in_stack_00000a10,in_stack_00000a08,
                  in_stack_00000a00,in_stack_000009f8,in_stack_00000a30);
  pnga_distribution(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
  pnga_mask_sync((long)iVar1,(long)iVar2);
  pnga_copy_patch(in_stack_00000a20,in_stack_00000a18,in_stack_00000a10,in_stack_00000a08,
                  in_stack_00000a00,in_stack_000009f8,in_stack_00000a30);
  pnga_distribution(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
  pnga_mask_sync((long)iVar1,(long)iVar2);
  pnga_copy_patch(in_stack_00000a20,in_stack_00000a18,in_stack_00000a10,in_stack_00000a08,
                  in_stack_00000a00,in_stack_000009f8,in_stack_00000a30);
  SPA[lVar5].ilo = SPA[lVar3].ilo;
  SPA[lVar5].ihi = SPA[lVar3].ihi;
  SPA[lVar5].nblocks = SPA[lVar3].nblocks;
  SPA[lVar5].nval = SPA[lVar3].nval;
  SPA[lVar5].maxval = SPA[lVar3].maxval;
  SPA[lVar5].max_nnz = SPA[lVar3].max_nnz;
  SPA[lVar5].ready = SPA[lVar3].ready;
  SPA[lVar5].grp = SPA[lVar3].grp;
  SPA[lVar5].val = (void *)0x0;
  SPA[lVar5].idx = (Integer *)0x0;
  SPA[lVar5].jdx = (Integer *)0x0;
  if (0 < SPA[lVar5].nblocks) {
    pIVar7 = (Integer *)malloc(SPA[lVar5].nblocks << 3);
    SPA[lVar5].blkidx = pIVar7;
    pIVar7 = (Integer *)malloc(SPA[lVar5].nblocks << 3);
    SPA[lVar5].blksize = pIVar7;
    pIVar7 = (Integer *)malloc(SPA[lVar5].nblocks << 3);
    SPA[lVar5].offset = pIVar7;
  }
  for (local_58 = 0; local_58 < SPA[lVar5].nblocks; local_58 = local_58 + 1) {
    SPA[lVar5].blkidx[local_58] = SPA[lVar3].blkidx[local_58];
    SPA[lVar5].blksize[local_58] = SPA[lVar3].blksize[local_58];
    SPA[lVar5].offset[local_58] = SPA[lVar3].offset[local_58];
  }
  if (iVar2 != 0) {
    pnga_pgroup_sync(in_stack_ffffffffffffff60);
  }
  return IVar4;
}

Assistant:

Integer pnga_sprs_array_duplicate(Integer s_a)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer new_hdl;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer s_dup;
  Integer lo, hi;
  Integer i;
  char p_trans[2];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* create new array with same properties as old array */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  s_dup = pnga_sprs_array_create(SPA[hdl].idim,SPA[hdl].jdim,SPA[hdl].type,
      SPA[hdl].idx_size);
  /* find handle for new array and duplicate internal GAs */
  new_hdl = GA_OFFSET + s_dup;
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_data,&SPA[new_hdl].g_data,"sparse_data_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_data",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_i,&SPA[new_hdl].g_i,"sparse_i_index_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_i",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_j,&SPA[new_hdl].g_j,"sparse_j_index_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_j",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_blk,&SPA[new_hdl].g_blk,"sparse_g_block_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_blk",0);
  }

  /* Copy data from old array to new array */
  p_trans[0]='N';
  p_trans[1]='\0';
  pnga_distribution(SPA[new_hdl].g_i,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_i,&lo,&hi,SPA[new_hdl].g_i,&lo,&hi);
  pnga_distribution(SPA[new_hdl].g_j,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_j,&lo,&hi,SPA[new_hdl].g_j,&lo,&hi);
  pnga_distribution(SPA[new_hdl].g_data,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_data,&lo,&hi,SPA[new_hdl].g_data,&lo,&hi);
  {
    Integer tlo[3],thi[3];
    pnga_distribution(SPA[new_hdl].g_blk,me,tlo,thi);
    pnga_mask_sync(local_sync_begin,local_sync_end);
    pnga_copy_patch(p_trans,SPA[hdl].g_blk,tlo,thi,SPA[new_hdl].g_blk,tlo,thi);
  }
  /* copy remaining data structures */
  SPA[new_hdl].ilo = SPA[hdl].ilo;
  SPA[new_hdl].ihi = SPA[hdl].ihi;
  SPA[new_hdl].nblocks = SPA[hdl].nblocks;
  SPA[new_hdl].nval = SPA[hdl].nval;
  SPA[new_hdl].maxval = SPA[hdl].maxval;
  SPA[new_hdl].max_nnz = SPA[hdl].max_nnz;
  SPA[new_hdl].ready = SPA[hdl].ready;
  SPA[new_hdl].grp = SPA[hdl].grp;
  SPA[new_hdl].val = NULL;
  SPA[new_hdl].idx = NULL;
  SPA[new_hdl].jdx = NULL;
  if (SPA[new_hdl].nblocks > 0) {
    SPA[new_hdl].blkidx
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
    SPA[new_hdl].blksize
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
    SPA[new_hdl].offset
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
  }
  for (i=0; i<SPA[new_hdl].nblocks; i++) {
    SPA[new_hdl].blkidx[i] = SPA[hdl].blkidx[i];
    SPA[new_hdl].blksize[i] = SPA[hdl].blksize[i];
    SPA[new_hdl].offset[i] = SPA[hdl].offset[i];
  }
  if (local_sync_end) pnga_pgroup_sync(grp);
  return s_dup;
}